

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O1

void * __thiscall ON_FixedSizePool::Element(ON_FixedSizePool *this,size_t element_index)

{
  void **ppvVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  bool bVar5;
  
  if (element_index < this->m_total_element_count) {
    bVar5 = (undefined8 *)this->m_first_block == (undefined8 *)0x0;
    if (bVar5) {
      puVar3 = (undefined8 *)0x0;
    }
    else {
      puVar3 = (undefined8 *)this->m_first_block;
      do {
        if (puVar3 == (undefined8 *)this->m_al_block) {
          puVar4 = (undefined8 *)0x0;
          ppvVar1 = &this->m_al_element_array;
        }
        else {
          puVar4 = (undefined8 *)*puVar3;
          ppvVar1 = (void **)(puVar3 + 1);
        }
        uVar2 = (ulong)((long)*ppvVar1 - (long)(puVar3 + 2)) / this->m_sizeof_element;
        if (element_index < uVar2) {
          puVar3 = (undefined8 *)((long)(puVar3 + 2) + this->m_sizeof_element * element_index);
          goto LAB_004919f9;
        }
        bVar5 = puVar4 == (undefined8 *)0x0;
        puVar3 = puVar4;
        element_index = element_index - uVar2;
      } while (!bVar5);
      puVar3 = (undefined8 *)0x0;
    }
LAB_004919f9:
    if (!bVar5) {
      return puVar3;
    }
  }
  return (void *)0x0;
}

Assistant:

void* ON_FixedSizePool::Element(size_t element_index) const
{
  if (element_index < (size_t)m_total_element_count)
  {
    const char* block;
    const char* block_end;
    const char* next_block;
    size_t block_count;

    for (block = (const char*)m_first_block; 0 != block; block = next_block)
    {
      if (block == m_al_block)
      {
        next_block = nullptr;

        // for debugging
        // block += sizeof(void*);
        // block_end = *((const char**)(block));
        // block += sizeof(void*);

        block_end = (const char*)m_al_element_array;
        block += 2*sizeof(void*);
      }
      else
      {
        next_block = *((const char**)block);
        block += sizeof(void*);
        block_end = *((const char**)(block));
        block += sizeof(void*);
      }
      block_count = (block_end - block) / m_sizeof_element;
      if (element_index < block_count)
        return ((void*)(block + element_index*m_sizeof_element));
      element_index -= block_count;
    }
  }

  return nullptr;
}